

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::ParticleBelief::Sample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          ParticleBelief *this,int num)

{
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_38;
  int local_1c;
  ParticleBelief *pPStack_18;
  int num_local;
  ParticleBelief *this_local;
  
  local_1c = num;
  pPStack_18 = this;
  this_local = (ParticleBelief *)__return_storage_ptr__;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&local_38,&this->particles_);
  Sample(__return_storage_ptr__,num,&local_38,(this->super_Belief).model_);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Sample(int num) const {
	return Sample(num, particles_, model_);
}